

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall CGraphics_Threaded::QuadsBegin(CGraphics_Threaded *this)

{
  int iVar1;
  undefined4 uVar2;
  long *in_RDI;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  dbg_assert_imp((char *)in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,(char *)0x12f62e
                );
  *(undefined4 *)((long)in_RDI + 0x12011c) = 1;
  (**(code **)(*in_RDI + 0xd0))(0,0,0x3f800000,in_RDI,0xffffffff);
  (**(code **)(*in_RDI + 200))(0);
  (**(code **)(*in_RDI + 0x108))(0x3f800000,0x3f800000,0x3f800000);
  iVar1 = (**(code **)(*(long *)in_RDI[0xc] + 0x28))();
  uVar2 = 0;
  if (1 < iVar1) {
    uVar2 = 0xffffffff;
  }
  *(undefined4 *)(in_RDI + 0x24035) = uVar2;
  return;
}

Assistant:

void CGraphics_Threaded::QuadsBegin()
{
	dbg_assert(m_Drawing == 0, "called Graphics()->QuadsBegin twice");
	m_Drawing = DRAWING_QUADS;

	QuadsSetSubset(0,0,1,1,-1);
	QuadsSetRotation(0);
	SetColor(1,1,1,1);
	m_TextureArrayIndex = m_pBackend->GetTextureArraySize() > 1 ? -1 : 0;
}